

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_location.hpp
# Opt level: O3

int __thiscall
jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>::compare
          (basic_path_element<char,_std::allocator<char>_> *this,
          basic_path_element<char,_std::allocator<char>_> *other)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  
  bVar1 = this->has_name_;
  if (bVar1 != other->has_name_) {
    return (uint)bVar1 - (uint)other->has_name_;
  }
  if (bVar1 != 0) {
    iVar2 = std::__cxx11::string::compare((string *)&this->name_);
    return iVar2;
  }
  uVar3 = 0xffffffff;
  if (other->index_ <= this->index_) {
    uVar3 = (uint)(other->index_ < this->index_);
  }
  return uVar3;
}

Assistant:

int compare(const basic_path_element& other) const
        {
            int diff = 0;
            if (has_name_ != other.has_name_)
            {
                diff = static_cast<int>(has_name_) - static_cast<int>(other.has_name_);
            }
            else
            {
                if (has_name_)
                {
                    diff = name_.compare(other.name_);
                }
                else if (index_ < other.index_)
                {
                    diff = -1;
                }
                else if (index_ > other.index_)
                {
                    diff = 1;
                }
                else
                {
                    diff = 0;
                }
            }
            return diff;
        }